

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::ConversionError::ConversionError
          (ConversionError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  string *delim;
  undefined8 uVar5;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ::std::operator+(&local_40,"Could not convert: ",name);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_40," = ");
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  delim = (string *)&pbVar4->field_2;
  if ((string *)local_a0._M_dataplus._M_p == delim) {
    local_a0.field_2._M_allocated_capacity = *(undefined8 *)delim;
    local_a0.field_2._8_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 8);
    local_a0.field_2._12_4_ = *(undefined4 *)((long)&pbVar4->field_2 + 0xc);
    local_a0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *(undefined8 *)delim;
  }
  local_a0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)delim;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  local_60._0_8_ = (pointer)(local_60 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,",","");
  detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((string *)&local_80,(detail *)results,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,delim);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    uVar5 = local_a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_80._8_8_ + local_a0._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_allocated_capacity != &local_70) {
      uVar5 = local_70._M_allocated_capacity;
    }
    if (local_80._8_8_ + local_a0._M_string_length <= (ulong)uVar5) {
      pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_80,0,0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      goto LAB_001b752e;
    }
  }
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_a0,(char *)local_80._M_allocated_capacity,local_80._8_8_);
LAB_001b752e:
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar4->_M_dataplus)._M_p;
  paVar1 = &pbVar4->field_2;
  if (paVar3 == paVar1) {
    local_c0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
  }
  else {
    local_c0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_c0._M_dataplus._M_p = (pointer)paVar3;
  }
  local_c0._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar4->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  ConversionError(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_allocated_capacity != &local_70) {
    operator_delete((void *)local_80._M_allocated_capacity,local_70._M_allocated_capacity + 1);
  }
  if ((pointer)local_60._0_8_ != (pointer)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_60._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ConversionError(std::string name, std::vector<std::string> results)
        : ConversionError("Could not convert: " + name + " = " + detail::join(results)) {}